

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::TZDBNameSearchHandler::handleMatch
          (TZDBNameSearchHandler *this,int32_t matchLength,CharacterNode *node,UErrorCode *status)

{
  UTimeZoneNameType nameType;
  int32_t matchLength_00;
  UBool UVar1;
  int iVar2;
  MatchInfoCollection *pMVar3;
  undefined4 in_register_00000034;
  char *__s2;
  MatchInfoCollection *local_d8;
  UnicodeString local_c8;
  undefined1 local_71;
  MatchInfoCollection *local_70;
  UTimeZoneNameType local_64;
  char *pcStack_60;
  UTimeZoneNameType ntype;
  char *region;
  int32_t j;
  UBool matchRegion;
  TZDBNameInfo *ninfo;
  int32_t i;
  int32_t valuesCount;
  TZDBNameInfo *defaultRegionMatch;
  TZDBNameInfo *match;
  UErrorCode *status_local;
  CharacterNode *node_local;
  TZDBNameSearchHandler *pTStack_18;
  int32_t matchLength_local;
  TZDBNameSearchHandler *this_local;
  
  __s2 = (char *)CONCAT44(in_register_00000034,matchLength);
  match = (TZDBNameInfo *)status;
  status_local = (UErrorCode *)node;
  node_local._4_4_ = matchLength;
  pTStack_18 = this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    defaultRegionMatch = (TZDBNameInfo *)0x0;
    _i = (TZDBNameInfo *)0x0;
    UVar1 = CharacterNode::hasValues((CharacterNode *)status_local);
    if (UVar1 != '\0') {
      ninfo._4_4_ = CharacterNode::countValues((CharacterNode *)status_local);
      for (ninfo._0_4_ = 0; (int)(uint)ninfo < ninfo._4_4_; ninfo._0_4_ = (uint)ninfo + 1) {
        __s2 = (char *)(ulong)(uint)ninfo;
        _j = (TZDBNameInfo *)CharacterNode::getValue((CharacterNode *)status_local,(uint)ninfo);
        if ((_j != (TZDBNameInfo *)0x0) && ((_j->type & this->fTypes) != UTZNM_UNKNOWN)) {
          if (_j->parseRegions == (char **)0x0) {
            if (_i == (TZDBNameInfo *)0x0) {
              _i = _j;
              defaultRegionMatch = _j;
            }
          }
          else {
            region._7_1_ = '\0';
            for (region._0_4_ = 0; (int)region < _j->nRegions; region._0_4_ = (int)region + 1) {
              __s2 = _j->parseRegions[(int)region];
              pcStack_60 = __s2;
              iVar2 = strcmp(this->fRegion,__s2);
              if (iVar2 == 0) {
                defaultRegionMatch = _j;
                region._7_1_ = '\x01';
                break;
              }
            }
            if (region._7_1_ != '\0') break;
            if (defaultRegionMatch == (TZDBNameInfo *)0x0) {
              defaultRegionMatch = _j;
            }
          }
        }
      }
      if (defaultRegionMatch != (TZDBNameInfo *)0x0) {
        local_64 = defaultRegionMatch->type;
        if (((defaultRegionMatch->ambiguousType != '\0') &&
            (((local_64 == UTZNM_SHORT_STANDARD || (local_64 == UTZNM_SHORT_DAYLIGHT)) &&
             ((this->fTypes & 0x10) != 0)))) && ((this->fTypes & 0x20) != 0)) {
          local_64 = UTZNM_SHORT_GENERIC;
        }
        if (this->fResults == (MatchInfoCollection *)0x0) {
          pMVar3 = (MatchInfoCollection *)UMemory::operator_new((UMemory *)0x10,(size_t)__s2);
          local_71 = 0;
          local_d8 = (MatchInfoCollection *)0x0;
          if (pMVar3 != (MatchInfoCollection *)0x0) {
            local_71 = 1;
            local_70 = pMVar3;
            TimeZoneNames::MatchInfoCollection::MatchInfoCollection(pMVar3);
            local_d8 = pMVar3;
          }
          this->fResults = local_d8;
          if (this->fResults == (MatchInfoCollection *)0x0) {
            *(undefined4 *)&match->mzID = 7;
          }
        }
        UVar1 = ::U_SUCCESS(*(UErrorCode *)&match->mzID);
        matchLength_00 = node_local._4_4_;
        nameType = local_64;
        if (UVar1 != '\0') {
          pMVar3 = this->fResults;
          UnicodeString::UnicodeString(&local_c8,defaultRegionMatch->mzID,-1);
          TimeZoneNames::MatchInfoCollection::addMetaZone
                    (pMVar3,nameType,matchLength_00,&local_c8,(UErrorCode *)match);
          UnicodeString::~UnicodeString(&local_c8);
          UVar1 = ::U_SUCCESS(*(UErrorCode *)&match->mzID);
          if ((UVar1 != '\0') && (this->fMaxMatchLen < node_local._4_4_)) {
            this->fMaxMatchLen = node_local._4_4_;
          }
        }
      }
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
TZDBNameSearchHandler::handleMatch(int32_t matchLength, const CharacterNode *node, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }

    TZDBNameInfo *match = NULL;
    TZDBNameInfo *defaultRegionMatch = NULL;

    if (node->hasValues()) {
        int32_t valuesCount = node->countValues();
        for (int32_t i = 0; i < valuesCount; i++) {
            TZDBNameInfo *ninfo = (TZDBNameInfo *)node->getValue(i);
            if (ninfo == NULL) {
                continue;
            }
            if ((ninfo->type & fTypes) != 0) {
                // Some tz database abbreviations are ambiguous. For example,
                // CST means either Central Standard Time or China Standard Time.
                // Unlike CLDR time zone display names, this implementation
                // does not use unique names. And TimeZoneFormat does not expect
                // multiple results returned for the same time zone type.
                // For this reason, this implementation resolve one among same
                // zone type with a same name at this level.
                if (ninfo->parseRegions == NULL) {
                    // parseRegions == null means this is the default metazone
                    // mapping for the abbreviation.
                    if (defaultRegionMatch == NULL) {
                        match = defaultRegionMatch = ninfo;
                    }
                } else {
                    UBool matchRegion = FALSE;
                    // non-default metazone mapping for an abbreviation
                    // comes with applicable regions. For example, the default
                    // metazone mapping for "CST" is America_Central,
                    // but if region is one of CN/MO/TW, "CST" is parsed
                    // as metazone China (China Standard Time).
                    for (int32_t j = 0; j < ninfo->nRegions; j++) {
                        const char *region = ninfo->parseRegions[j];
                        if (uprv_strcmp(fRegion, region) == 0) {
                            match = ninfo;
                            matchRegion = TRUE;
                            break;
                        }
                    }
                    if (matchRegion) {
                        break;
                    }
                    if (match == NULL) {
                        match = ninfo;
                    }
                }
            }
        }

        if (match != NULL) {
            UTimeZoneNameType ntype = match->type;
            // Note: Workaround for duplicated standard/daylight names
            // The tz database contains a few zones sharing a
            // same name for both standard time and daylight saving
            // time. For example, Australia/Sydney observes DST,
            // but "EST" is used for both standard and daylight.
            // When both SHORT_STANDARD and SHORT_DAYLIGHT are included
            // in the find operation, we cannot tell which one was
            // actually matched.
            // TimeZoneFormat#parse returns a matched name type (standard
            // or daylight) and DateFormat implementation uses the info to
            // to adjust actual time. To avoid false type information,
            // this implementation replaces the name type with SHORT_GENERIC.
            if (match->ambiguousType
                    && (ntype == UTZNM_SHORT_STANDARD || ntype == UTZNM_SHORT_DAYLIGHT)
                    && (fTypes & UTZNM_SHORT_STANDARD) != 0
                    && (fTypes & UTZNM_SHORT_DAYLIGHT) != 0) {
                ntype = UTZNM_SHORT_GENERIC;
            }

            if (fResults == NULL) {
                fResults = new TimeZoneNames::MatchInfoCollection();
                if (fResults == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                }
            }
            if (U_SUCCESS(status)) {
                U_ASSERT(fResults != NULL);
                U_ASSERT(match->mzID != NULL);
                fResults->addMetaZone(ntype, matchLength, UnicodeString(match->mzID, -1), status);
                if (U_SUCCESS(status) && matchLength > fMaxMatchLen) {
                    fMaxMatchLen = matchLength;
                }
            }
        }
    }
    return TRUE;
}